

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O3

InplaceStr GetTypeNameInScope(ExpressionContext *ctx,ScopeData *scope,InplaceStr str)

{
  NamespaceData *pNVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  char *pcVar5;
  ScopeData *pSVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  uint strLength;
  ulong uVar10;
  InplaceStr IVar11;
  char *__s;
  
  pcVar9 = str.end;
  pcVar5 = str.begin;
  __s = pcVar5;
  if (scope != (ScopeData *)0x0) {
    uVar10 = (long)pcVar9 - (long)pcVar5;
    bVar2 = false;
    uVar7 = uVar10 & 0xffffffff;
    pSVar6 = scope;
    do {
      iVar8 = (int)uVar7;
      if (((pSVar6->ownerType != (TypeBase *)0x0) || (pSVar6->ownerFunction != (FunctionData *)0x0))
         && (!bVar2)) break;
      pNVar1 = pSVar6->ownerNamespace;
      if (pNVar1 != (NamespaceData *)0x0) {
        uVar7 = (ulong)(iVar8 + (*(int *)&(pNVar1->name).name.end -
                                *(int *)&(pNVar1->name).name.begin) + 1);
        bVar2 = true;
      }
      iVar8 = (int)uVar7;
      pSVar6 = pSVar6->scope;
    } while (pSVar6 != (ScopeData *)0x0);
    if (bVar2) {
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(iVar8 + 1));
      __s = (char *)CONCAT44(extraout_var,iVar3);
      pcVar9 = __s + ((ulong)(iVar8 + 1) - 1);
      *pcVar9 = '\0';
      if ((int)uVar10 != 0) {
        pcVar9 = pcVar9 + -(uVar10 & 0xffffffff);
        memcpy(pcVar9,pcVar5,uVar10 & 0xffffffff);
      }
      for (; scope != (ScopeData *)0x0; scope = scope->scope) {
        pNVar1 = scope->ownerNamespace;
        if (pNVar1 != (NamespaceData *)0x0) {
          pcVar5 = (pNVar1->name).name.begin;
          iVar8 = *(int *)&(pNVar1->name).name.end;
          pcVar9[-1] = '.';
          uVar7 = (ulong)(uint)(iVar8 - (int)pcVar5);
          pcVar9 = pcVar9 + (-1 - uVar7);
          memcpy(pcVar9,pcVar5,uVar7);
        }
      }
      if (pcVar9 != __s) {
        __assert_fail("pos == name",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                      ,0x23c,
                      "InplaceStr GetTypeNameInScope(ExpressionContext &, ScopeData *, InplaceStr)")
        ;
      }
      sVar4 = strlen(__s);
      pcVar9 = __s + sVar4;
    }
  }
  IVar11.end = pcVar9;
  IVar11.begin = __s;
  return IVar11;
}

Assistant:

InplaceStr GetTypeNameInScope(ExpressionContext &ctx, ScopeData *scope, InplaceStr str)
{
	bool foundNamespace = false;

	unsigned nameLength = str.length();

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if((curr->ownerType || curr->ownerFunction) && !foundNamespace)
			break;

		if(curr->ownerNamespace)
		{
			nameLength += curr->ownerNamespace->name.name.length() + 1;

			foundNamespace = true;
		}
	}

	nameLength += 1;

	if(!foundNamespace)
		return str;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	// Format a string back-to-front
	char *pos = name + nameLength;

	pos -= 1;
	*pos = 0;

	if(unsigned strLength = str.length())
	{
		pos -= strLength;
		memcpy(pos, str.begin, strLength);
	}

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if(curr->ownerNamespace)
		{
			InplaceStr nsName = curr->ownerNamespace->name.name;

			pos -= 1;
			*pos = '.';

			pos -= nsName.length();
			memcpy(pos, nsName.begin, nsName.length());
		}
	}

	assert(pos == name);

	return InplaceStr(name);
}